

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_ellswift_encode
              (secp256k1_context *ctx,uchar *ell64,secp256k1_pubkey *pubkey,uchar *rnd32)

{
  uint *puVar1;
  uint *puVar2;
  byte bVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  secp256k1_ecmult_gen_context *a;
  char cVar10;
  int iVar11;
  int extraout_EAX;
  int extraout_EAX_00;
  ulong uVar12;
  long lVar13;
  secp256k1_ecmult_gen_context *hasher;
  secp256k1_fe *data;
  secp256k1_ge *extraout_RDX;
  ulong uVar14;
  uchar *seckey;
  uint uVar15;
  ulong uVar16;
  secp256k1_ge *u32;
  secp256k1_ge *elem;
  secp256k1_ecmult_gen_context *psVar17;
  ulong uVar18;
  ulong uVar19;
  secp256k1_fe *a_00;
  undefined1 auVar20 [16];
  size_t ser_size;
  uchar p64 [64];
  secp256k1_ge p;
  secp256k1_fe t;
  secp256k1_scalar asStack_3a8 [2];
  secp256k1_ge sStack_350;
  secp256k1_sha256 sStack_2e8;
  secp256k1_fe sStack_280;
  ulong uStack_250;
  secp256k1_ge *psStack_248;
  ulong uStack_240;
  secp256k1_fe *psStack_238;
  secp256k1_ecmult_gen_context *psStack_230;
  secp256k1_fe *psStack_228;
  secp256k1_ge *psStack_218;
  secp256k1_ecmult_gen_context *psStack_210;
  long lStack_208;
  secp256k1_fe sStack_200;
  byte abStack_1d0 [40];
  uchar *puStack_1a8;
  size_t local_170;
  secp256k1_sha256 local_168;
  undefined1 local_f8 [224];
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ellswift_encode_cold_5();
  }
  else if (ell64 != (uchar *)0x0) {
    if (pubkey == (secp256k1_pubkey *)0x0) {
      secp256k1_ellswift_encode_cold_3();
      return 0;
    }
    if (rnd32 == (uchar *)0x0) {
      secp256k1_ellswift_encode_cold_2();
      return 0;
    }
    iVar11 = secp256k1_pubkey_load(ctx,(secp256k1_ge *)(local_f8 + 0x48),pubkey);
    if (iVar11 == 0) {
      ell64[0x30] = '\0';
      ell64[0x31] = '\0';
      ell64[0x32] = '\0';
      ell64[0x33] = '\0';
      ell64[0x34] = '\0';
      ell64[0x35] = '\0';
      ell64[0x36] = '\0';
      ell64[0x37] = '\0';
      ell64[0x38] = '\0';
      ell64[0x39] = '\0';
      ell64[0x3a] = '\0';
      ell64[0x3b] = '\0';
      ell64[0x3c] = '\0';
      ell64[0x3d] = '\0';
      ell64[0x3e] = '\0';
      ell64[0x3f] = '\0';
      ell64[0x20] = '\0';
      ell64[0x21] = '\0';
      ell64[0x22] = '\0';
      ell64[0x23] = '\0';
      ell64[0x24] = '\0';
      ell64[0x25] = '\0';
      ell64[0x26] = '\0';
      ell64[0x27] = '\0';
      ell64[0x28] = '\0';
      ell64[0x29] = '\0';
      ell64[0x2a] = '\0';
      ell64[0x2b] = '\0';
      ell64[0x2c] = '\0';
      ell64[0x2d] = '\0';
      ell64[0x2e] = '\0';
      ell64[0x2f] = '\0';
      ell64[0x10] = '\0';
      ell64[0x11] = '\0';
      ell64[0x12] = '\0';
      ell64[0x13] = '\0';
      ell64[0x14] = '\0';
      ell64[0x15] = '\0';
      ell64[0x16] = '\0';
      ell64[0x17] = '\0';
      ell64[0x18] = '\0';
      ell64[0x19] = '\0';
      ell64[0x1a] = '\0';
      ell64[0x1b] = '\0';
      ell64[0x1c] = '\0';
      ell64[0x1d] = '\0';
      ell64[0x1e] = '\0';
      ell64[0x1f] = '\0';
      ell64[0] = '\0';
      ell64[1] = '\0';
      ell64[2] = '\0';
      ell64[3] = '\0';
      ell64[4] = '\0';
      ell64[5] = '\0';
      ell64[6] = '\0';
      ell64[7] = '\0';
      ell64[8] = '\0';
      ell64[9] = '\0';
      ell64[10] = '\0';
      ell64[0xb] = '\0';
      ell64[0xc] = '\0';
      ell64[0xd] = '\0';
      ell64[0xe] = '\0';
      ell64[0xf] = '\0';
      return 0;
    }
    psVar17 = (secp256k1_ecmult_gen_context *)local_f8;
    local_f8._48_8_ = 0;
    local_f8._56_8_ = 0;
    local_f8._32_8_ = 0;
    local_f8._40_8_ = 0;
    local_f8._16_8_ = 0;
    local_f8._24_8_ = 0;
    local_f8._0_8_ = 0;
    local_f8._8_8_ = 0;
    local_168.s[0] = 0xd1a6524b;
    local_168.s[1] = 0x28594b3;
    local_168.s[2] = 0x96e42f4e;
    local_168.s[3] = 0x1037a177;
    local_168.s[4] = 0x1b8fcb8b;
    local_168.s[5] = 0x56023885;
    local_168.s[6] = 0x2560ede1;
    local_168.s[7] = 0xd626b715;
    local_168.bytes = 0x40;
    elem = (secp256k1_ge *)(local_f8 + 0x48);
    hasher = (secp256k1_ecmult_gen_context *)0x1;
    iVar11 = secp256k1_eckey_pubkey_serialize(elem,(uchar *)psVar17,&local_170,1);
    if ((iVar11 != 0) && (local_170 == 0x21)) {
      secp256k1_sha256_write(&local_168,local_f8,0x40);
      secp256k1_sha256_write(&local_168,rnd32,0x20);
      secp256k1_ellswift_elligatorswift_var
                (ell64,(secp256k1_fe *)(local_f8 + 0xb0),(secp256k1_ge *)(local_f8 + 0x48),
                 &local_168);
      secp256k1_fe_get_b32(ell64 + 0x20,(secp256k1_fe *)(local_f8 + 0xb0));
      return 1;
    }
    secp256k1_ellswift_encode_cold_1();
    puStack_1a8 = ell64;
    uVar19 = 0;
    lStack_208 = 0x1000003d1;
    uVar16 = 0;
    psStack_218 = extraout_RDX;
    psStack_210 = psVar17;
    do {
      iVar11 = (int)uVar16;
      if (iVar11 == 0) {
        psStack_228 = (secp256k1_fe *)0x1208e2;
        secp256k1_ellswift_prng(abStack_1d0,(secp256k1_sha256 *)hasher,(uint32_t)uVar19);
        iVar11 = 0x40;
        uVar19 = (ulong)((uint32_t)uVar19 + 1);
      }
      uVar15 = iVar11 - 1;
      uVar16 = (ulong)uVar15;
      bVar3 = abStack_1d0[uVar15 >> 1];
      a_00 = (secp256k1_fe *)(ulong)bVar3;
      psStack_228 = (secp256k1_fe *)0x120904;
      secp256k1_ellswift_prng((uchar *)elem,(secp256k1_sha256 *)hasher,(uint32_t)uVar19);
      psStack_228 = (secp256k1_fe *)0x12090f;
      secp256k1_fe_impl_set_b32_mod(&sStack_200,(uchar *)elem);
      sStack_200.magnitude = 1;
      sStack_200.normalized = 0;
      psStack_228 = (secp256k1_fe *)0x120920;
      secp256k1_fe_verify(&sStack_200);
      psStack_228 = (secp256k1_fe *)0x120928;
      secp256k1_fe_verify(&sStack_200);
      uVar12 = (sStack_200.n[4] >> 0x30) * lStack_208 + sStack_200.n[0];
      if (((uVar12 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar12 & 0xfffffffffffff) == 0)) {
        uVar14 = (uVar12 >> 0x34) + sStack_200.n[1];
        u32 = (secp256k1_ge *)((uVar14 >> 0x34) + sStack_200.n[2]);
        psVar17 = (secp256k1_ecmult_gen_context *)(((ulong)u32 >> 0x34) + sStack_200.n[3]);
        uVar18 = ((ulong)psVar17 >> 0x34) + (sStack_200.n[4] & 0xffffffffffff);
        data = (secp256k1_fe *)
               ((uVar14 | uVar12 | (ulong)u32 | (ulong)psVar17) & 0xfffffffffffff | uVar18);
        if ((data == (secp256k1_fe *)0x0) ||
           (data = (secp256k1_fe *)0x1000003d0,
           ((uVar12 | 0x1000003d0) & uVar14 & (ulong)u32 & (ulong)psVar17 &
           (uVar18 ^ 0xf000000000000)) == 0xfffffffffffff)) {
          psStack_228 = (secp256k1_fe *)0x120af2;
          secp256k1_ellswift_elligatorswift_var_cold_1();
          goto LAB_00120af2;
        }
      }
      uVar19 = (ulong)((uint32_t)uVar19 + 1);
      uVar15 = bVar3 >> ((char)uVar15 * '\x04' & 4U) & 7;
      a_00 = (secp256k1_fe *)(ulong)uVar15;
      psStack_228 = (secp256k1_fe *)0x120a12;
      data = a_00;
      u32 = psStack_218;
      iVar11 = secp256k1_ellswift_xswiftec_inv_var
                         ((secp256k1_fe *)psStack_210,&psStack_218->x,&sStack_200,uVar15);
      a = psStack_210;
      if (iVar11 != 0) {
        psStack_228 = (secp256k1_fe *)0x120a27;
        secp256k1_fe_normalize_var((secp256k1_fe *)psStack_210);
        psStack_228 = (secp256k1_fe *)0x120a2f;
        psVar17 = a;
        secp256k1_fe_verify((secp256k1_fe *)a);
        hasher = a;
        if (*(int *)((long)(a->ge_offset).x.n + 4) == 0) {
LAB_00120af2:
          psStack_228 = (secp256k1_fe *)0x120af7;
          secp256k1_ellswift_elligatorswift_var_cold_3();
        }
        else {
          uVar16 = *(ulong *)a;
          a_00 = &psStack_218->y;
          psStack_228 = (secp256k1_fe *)0x120a4f;
          psVar17 = (secp256k1_ecmult_gen_context *)a_00;
          secp256k1_fe_verify(a_00);
          elem = psStack_218;
          if ((psStack_218->y).normalized != 0) {
            if ((((uint)uVar16 ^ (uint)a_00->n[0]) & 1) != 0) {
              psStack_228 = (secp256k1_fe *)0x120a7a;
              secp256k1_fe_verify((secp256k1_fe *)a);
              psStack_228 = (secp256k1_fe *)0x120a87;
              secp256k1_fe_verify_magnitude((secp256k1_fe *)a,1);
              uVar4 = (a->scalar_offset).d[0];
              uVar5 = (a->scalar_offset).d[1];
              uVar6 = (a->scalar_offset).d[2];
              *(long *)a = 0x3ffffbfffff0bc - *(long *)a;
              (a->scalar_offset).d[0] = 0x3ffffffffffffc - uVar4;
              (a->scalar_offset).d[1] = 0x3ffffffffffffc - uVar5;
              (a->scalar_offset).d[2] = 0x3ffffffffffffc - uVar6;
              (a->scalar_offset).d[3] = 0x3fffffffffffc - (a->scalar_offset).d[3];
              (a->ge_offset).x.n[0] = 2;
              psStack_228 = (secp256k1_fe *)0x120ad7;
              secp256k1_fe_verify((secp256k1_fe *)a);
              secp256k1_fe_normalize_var((secp256k1_fe *)a);
              return extraout_EAX_00;
            }
            return extraout_EAX;
          }
        }
        psStack_228 = (secp256k1_fe *)secp256k1_ellswift_create;
        secp256k1_ellswift_elligatorswift_var_cold_2();
        uStack_250 = uVar16;
        psStack_248 = elem;
        uStack_240 = uVar19;
        psStack_238 = a_00;
        psStack_230 = hasher;
        psStack_228 = &sStack_200;
        if (psVar17 == (secp256k1_ecmult_gen_context *)0x0) {
          secp256k1_ellswift_create_cold_6();
        }
        else if (u32 != (secp256k1_ge *)0x0) {
          (u32->y).n[0] = 0;
          (u32->y).n[1] = 0;
          *(undefined1 (*) [16])((u32->x).n + 4) = (undefined1  [16])0x0;
          (u32->x).n[2] = 0;
          (u32->x).n[3] = 0;
          (u32->x).n[0] = 0;
          (u32->x).n[1] = 0;
          if (psVar17->built == 0) {
            secp256k1_ellswift_create_cold_4();
            return 0;
          }
          if (seckey == (uchar *)0x0) {
            secp256k1_ellswift_create_cold_3();
            return 0;
          }
          iVar11 = secp256k1_ec_pubkey_create_helper(psVar17,asStack_3a8,&sStack_350,seckey);
          if ((int)psVar17[1].scalar_offset.d[3] != 0) {
            secp256k1_ellswift_create_cold_1();
          }
          secp256k1_fe_normalize_var(&sStack_350.x);
          secp256k1_fe_normalize_var(&sStack_350.y);
          sStack_2e8.s[0] = 0xd29e1bf5;
          sStack_2e8.s[1] = 0xf7025f42;
          sStack_2e8.s[2] = 0x9b024773;
          sStack_2e8.s[3] = 0x94cb7d5;
          sStack_2e8.s[4] = 0xe59ed789;
          sStack_2e8.s[5] = 0x3bc9786;
          sStack_2e8.s[6] = 0x68335b35;
          sStack_2e8.s[7] = 0x4e363b53;
          sStack_2e8.bytes = 0x40;
          secp256k1_sha256_write(&sStack_2e8,seckey,0x20);
          secp256k1_sha256_write(&sStack_2e8,"",0x20);
          if ((int)psVar17[1].scalar_offset.d[3] != 0) {
            secp256k1_ellswift_create_cold_2();
          }
          if (data != (secp256k1_fe *)0x0) {
            secp256k1_sha256_write(&sStack_2e8,(uchar *)data,0x20);
          }
          secp256k1_ellswift_elligatorswift_var((uchar *)u32,&sStack_280,&sStack_350,&sStack_2e8);
          secp256k1_fe_get_b32((uchar *)((u32->x).n + 4),&sStack_280);
          cVar10 = ((byte)iVar11 ^ 1) - 1;
          auVar20 = ZEXT216(CONCAT11(cVar10,cVar10));
          auVar20 = pshuflw(auVar20,auVar20,0);
          uVar15 = auVar20._0_4_;
          lVar13 = 0;
          do {
            puVar1 = (uint *)((long)(u32->x).n + lVar13);
            uVar7 = puVar1[1];
            uVar8 = puVar1[2];
            uVar9 = puVar1[3];
            puVar2 = (uint *)((long)(u32->x).n + lVar13);
            *puVar2 = *puVar1 & uVar15;
            puVar2[1] = uVar7 & uVar15;
            puVar2[2] = uVar8 & uVar15;
            puVar2[3] = uVar9 & uVar15;
            lVar13 = lVar13 + 0x10;
          } while (lVar13 != 0x40);
          return iVar11;
        }
        secp256k1_ellswift_create_cold_5();
        return 0;
      }
    } while( true );
  }
  secp256k1_ellswift_encode_cold_4();
  return 0;
}

Assistant:

int secp256k1_ellswift_encode(const secp256k1_context *ctx, unsigned char *ell64, const secp256k1_pubkey *pubkey, const unsigned char *rnd32) {
    secp256k1_ge p;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(ell64 != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(rnd32 != NULL);

    if (secp256k1_pubkey_load(ctx, &p, pubkey)) {
        secp256k1_fe t;
        unsigned char p64[64] = {0};
        size_t ser_size;
        int ser_ret;
        secp256k1_sha256 hash;

        /* Set up hasher state; the used RNG is H(pubkey || "\x00"*31 || rnd32 || cnt++), using
         * BIP340 tagged hash with tag "secp256k1_ellswift_encode". */
        secp256k1_ellswift_sha256_init_encode(&hash);
        ser_ret = secp256k1_eckey_pubkey_serialize(&p, p64, &ser_size, 1);
#ifdef VERIFY
        VERIFY_CHECK(ser_ret && ser_size == 33);
#else
        (void)ser_ret;
#endif
        secp256k1_sha256_write(&hash, p64, sizeof(p64));
        secp256k1_sha256_write(&hash, rnd32, 32);

        /* Compute ElligatorSwift encoding and construct output. */
        secp256k1_ellswift_elligatorswift_var(ell64, &t, &p, &hash); /* puts u in ell64[0..32] */
        secp256k1_fe_get_b32(ell64 + 32, &t); /* puts t in ell64[32..64] */
        return 1;
    }
    /* Only reached in case the provided pubkey is invalid. */
    memset(ell64, 0, 64);
    return 0;
}